

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsptree.c
# Opt level: O3

void bsp_destroy(void *handle)

{
  ulong uVar1;
  
  uVar1 = 0xffffffffffffffff;
  do {
    array_destroy(*(void **)(*handle + 8 + uVar1 * 8));
    uVar1 = uVar1 + 1;
  } while (uVar1 < *(byte *)((long)handle + 8));
  free(*handle);
  if (*(bsp_node **)((long)handle + 0x10) != (bsp_node *)0x0) {
    _bsp_destroy_node(*(bsp_node **)((long)handle + 0x10));
  }
  free(handle);
  return;
}

Assistant:

void
bsp_destroy(
    void * handle )
{
    bsp_tree * tree;
    int i;

    tree = (bsp_tree *) handle;
    assert( tree != NULL );
    for ( i = 0; i <= tree->dimensions; i++ )
        array_destroy( tree->pointarrays[i] );
    free( tree->pointarrays );

    if ( tree->top != NULL )
        _bsp_destroy_node( tree->top );
    free( tree );
}